

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_SGN(Context *ctx)

{
  char local_d8 [8];
  char code [128];
  char src0 [64];
  Context *ctx_local;
  
  make_METAL_srcarg_string_masked(ctx,0,code + 0x78,0x40);
  ctx->metal_need_header_common = 1;
  make_METAL_destarg_assign(ctx,local_d8,0x80,"sign(%s)",code + 0x78);
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_METAL_SGN(Context *ctx)
{
    // (we don't need the temporary registers specified for the D3D opcode.)
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char code[128];
    ctx->metal_need_header_common = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code), "sign(%s)", src0);
    output_line(ctx, "%s", code);
}